

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O1

size_t measure_string(uint length,char *str)

{
  byte bVar1;
  size_t sVar2;
  ulong uVar3;
  long lVar4;
  
  if (length != 0) {
    uVar3 = 0;
    sVar2 = 0;
    do {
      bVar1 = str[uVar3];
      lVar4 = 2;
      if (((0x22 < (ulong)bVar1) || ((0x400003700U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) &&
         (bVar1 != 0x5c)) {
        lVar4 = 1;
      }
      sVar2 = sVar2 + lVar4;
      uVar3 = uVar3 + 1;
    } while (length != uVar3);
    return sVar2;
  }
  return 0;
}

Assistant:

static size_t measure_string (unsigned int length,
                              const char *str)
{
   unsigned int i;
   size_t measured_length = 0;

   for(i = 0; i < length; ++ i)
   {
      int c = str[i];

      switch (c)
      {
      case '"':
      case '\\':
      case '\b':
      case '\f':
      case '\n':
      case '\r':
      case '\t':

         measured_length += 2;
         break;

      default:

         ++ measured_length;
         break;
      };
   };

   return measured_length;
}